

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O0

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  bool bVar1;
  uint c_00;
  uint32_t uVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  size_t N_00;
  size_t N_01;
  size_t N_02;
  size_t bucketsize2;
  size_t bucketsize1;
  size_t bucketsize0;
  uint b_1;
  uint c;
  uint b;
  uint j_1;
  uint j;
  array<unsigned_int,_32UL> cache;
  size_t i;
  undefined1 local_98 [4];
  uint partval;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  size_t depth_local;
  size_t N_local;
  uchar **strings_local;
  
  buckets._M_elems[2]._32_8_ = depth;
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
  }
  else {
    std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::array
              ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98);
    c_00 = pseudo_median<unsigned_int>(strings,N,buckets._M_elems[2]._32_8_);
    cache._M_elems[0x1e] = 0;
    cache._M_elems[0x1f] = 0;
    for (; (ulong)cache._M_elems._120_8_ < N - (N & 0x1f);
        cache._M_elems._120_8_ = cache._M_elems._120_8_ + 0x20) {
      for (b = 0; b < 0x20; b = b + 1) {
        uVar2 = get_char<unsigned_int>
                          (strings[cache._M_elems._120_8_ + (ulong)b],buckets._M_elems[2]._32_8_);
        pvVar4 = std::array<unsigned_int,_32UL>::operator[]
                           ((array<unsigned_int,_32UL> *)&j_1,(ulong)b);
        *pvVar4 = uVar2;
      }
      for (c = 0; c < 0x20; c = c + 1) {
        pvVar4 = std::array<unsigned_int,_32UL>::operator[]
                           ((array<unsigned_int,_32UL> *)&j_1,(ulong)c);
        uVar3 = get_bucket<unsigned_int>(*pvVar4,c_00);
        pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                           ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,
                            (ulong)uVar3);
        vector_block<unsigned_char_*,_1024U>::push_back
                  (pvVar5,strings + cache._M_elems._120_8_ + (ulong)c);
      }
    }
    for (; (ulong)cache._M_elems._120_8_ < N; cache._M_elems._120_8_ = cache._M_elems._120_8_ + 1) {
      uVar2 = get_char<unsigned_int>(strings[cache._M_elems._120_8_],buckets._M_elems[2]._32_8_);
      uVar3 = get_bucket<unsigned_int>(uVar2,c_00);
      pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                         ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,(ulong)uVar3)
      ;
      vector_block<unsigned_char_*,_1024U>::push_back(pvVar5,strings + cache._M_elems._120_8_);
    }
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,0);
    N_00 = vector_block<unsigned_char_*,_1024U>::size(pvVar5);
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,1);
    N_01 = vector_block<unsigned_char_*,_1024U>::size(pvVar5);
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,2);
    N_02 = vector_block<unsigned_char_*,_1024U>::size(pvVar5);
    if (N_00 + N_01 + N_02 != N) {
      __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                    ,0x5d,
                    "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned int]"
                   );
    }
    if (N_00 != 0) {
      pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                         ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,0);
      copy<unsigned_char*,1024u,unsigned_char**>(pvVar5,strings);
    }
    if (N_01 != 0) {
      pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                         ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,1);
      copy<unsigned_char*,1024u,unsigned_char**>(pvVar5,strings + N_00);
    }
    if (N_02 != 0) {
      pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                         ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,2);
      copy<unsigned_char*,1024u,unsigned_char**>(pvVar5,strings + N_00 + N_01);
    }
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,0);
    clear_bucket<vector_block<unsigned_char*,1024u>>(pvVar5);
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,1);
    clear_bucket<vector_block<unsigned_char*,1024u>>(pvVar5);
    pvVar5 = std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::operator[]
                       ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98,2);
    clear_bucket<vector_block<unsigned_char*,1024u>>(pvVar5);
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
              (strings,N_00,buckets._M_elems[2]._32_8_);
    bVar1 = is_end<unsigned_int>(c_00);
    if (!bVar1) {
      multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
                (strings + N_00,N_01,buckets._M_elems[2]._32_8_ + 4);
    }
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
              (strings + N_00 + N_01,N_02,buckets._M_elems[2]._32_8_);
    std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::~array
              ((array<vector_block<unsigned_char_*,_1024U>,_3UL> *)local_98);
  }
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}